

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O0

void __thiscall
jsonrpccxx::JsonRpcException::JsonRpcException(JsonRpcException *this,int code,string *message)

{
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *message_local;
  JsonRpcException *pJStack_10;
  int code_local;
  JsonRpcException *this_local;
  
  local_20 = message;
  message_local._4_4_ = code;
  pJStack_10 = this;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__JsonRpcException_002173f8;
  this->code = message_local._4_4_;
  std::__cxx11::string::string((string *)&this->message,(string *)local_20);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&this->data,(nullptr_t)0x0);
  std::__cxx11::to_string(&local_60,message_local._4_4_);
  std::operator+(&local_40,&local_60,": ");
  std::operator+(&this->err,&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

JsonRpcException(int code, const std::string &message) noexcept : code(code), message(message), data(nullptr), err(std::to_string(code) + ": " + message) {}